

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openxr_program.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_53f39::OpenXrProgram::CreateSwapchains(OpenXrProgram *this)

{
  XrViewConfigurationType XVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  XrInstance pXVar4;
  XrSystemId XVar5;
  XrSession pXVar6;
  uint uVar7;
  XrSwapchain pXVar8;
  bool bVar9;
  XrResult XVar10;
  int iVar11;
  element_type *peVar12;
  ulong uVar13;
  XrViewConfigurationView *pXVar14;
  size_type sVar15;
  long *plVar16;
  element_type *peVar17;
  undefined4 extraout_var;
  reference plVar18;
  undefined8 uVar19;
  reference ppXVar20;
  char *pcVar21;
  char *pcVar22;
  pair<XrSwapchain_T_*,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>_>
  local_458;
  undefined1 local_438 [8];
  vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
  swapchainImages;
  undefined1 auStack_418 [4];
  uint32_t imageCount;
  Swapchain swapchain;
  XrSwapchainCreateInfo swapchainCreateInfo;
  string local_3c0 [32];
  reference local_3a0;
  XrViewConfigurationView *vp;
  string local_390 [4];
  uint32_t i;
  __cxx11 local_370 [39];
  byte local_349;
  long lStack_348;
  bool selected;
  int64_t format;
  iterator __end3;
  iterator __begin3;
  vector<long,_std::allocator<long>_> *__range3;
  string swapchainFormatsString;
  allocator local_301;
  string local_300 [39];
  allocator<long> local_2d9;
  undefined1 local_2d8 [8];
  vector<long,_std::allocator<long>_> swapchainFormats;
  undefined1 local_2b8 [4];
  uint32_t swapchainFormatCount;
  value_type local_278;
  uint local_250;
  allocator local_249;
  uint32_t viewCount;
  string local_228 [32];
  string local_208 [32];
  string local_1e8 [32];
  undefined4 local_1c8 [2];
  XrSystemProperties systemProperties;
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  OpenXrProgram *local_10;
  OpenXrProgram *this_local;
  
  local_10 = this;
  if (this->m_session == (XrSession)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Check failed",&local_31);
    Throw((string *)local_30,"m_session != XR_NULL_HANDLE",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:576"
         );
  }
  bVar9 = std::vector<Swapchain,_std::allocator<Swapchain>_>::empty(&this->m_swapchains);
  if (!bVar9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"Check failed",&local_69);
    Throw((string *)local_68,"m_swapchains.empty()",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:577"
         );
  }
  bVar9 = std::vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>::empty
                    (&this->m_configViews);
  if (!bVar9) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_90,"Check failed",
               (allocator *)((long)&systemProperties.trackingProperties.positionTracking + 3));
    Throw((string *)local_90,"m_configViews.empty()",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:578"
         );
  }
  memset(local_1c8,0,0x130);
  local_1c8[0] = 5;
  XVar10 = xrGetSystemProperties(this->m_instance,this->m_systemId,local_1c8);
  CheckXrResult(XVar10,"xrGetSystemProperties(m_instance, m_systemId, &systemProperties)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:582"
               );
  Fmt_abi_cxx11_((char *)local_1e8,"System Properties: Name=%s VendorId=%d",
                 (undefined1 *)((long)&systemProperties.systemId + 4),
                 (ulong)(uint)systemProperties.systemId);
  Log::Write(Info,local_1e8);
  std::__cxx11::string::~string((string *)local_1e8);
  Fmt_abi_cxx11_((char *)local_208,
                 "System Graphics Properties: MaxWidth=%d MaxHeight=%d MaxLayers=%d",
                 (ulong)(uint)systemProperties.systemName._252_4_,
                 (ulong)(uint)systemProperties.systemName._248_4_,
                 (ulong)systemProperties.graphicsProperties.maxSwapchainImageHeight);
  Log::Write(Info,local_208);
  std::__cxx11::string::~string((string *)local_208);
  pcVar21 = "False";
  pcVar22 = "False";
  if (systemProperties.graphicsProperties.maxSwapchainImageWidth == 1) {
    pcVar22 = "True";
  }
  if (systemProperties.graphicsProperties.maxLayerCount == 1) {
    pcVar21 = "True";
  }
  Fmt_abi_cxx11_((char *)local_228,
                 "System Tracking Properties: OrientationTracking=%s PositionTracking=%s",pcVar22,
                 pcVar21);
  Log::Write(Info,local_228);
  std::__cxx11::string::~string((string *)local_228);
  peVar12 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_options);
  if ((peVar12->Parsed).ViewConfigType != XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&viewCount,"Unsupported view configuration type",&local_249);
    Throw((string *)&viewCount,
          "m_options->Parsed.ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO",
          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:599"
         );
  }
  pXVar4 = this->m_instance;
  XVar5 = this->m_systemId;
  peVar12 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_options);
  XVar10 = xrEnumerateViewConfigurationViews
                     (pXVar4,XVar5,(peVar12->Parsed).ViewConfigType,0,&local_250,0);
  CheckXrResult(XVar10,
                "xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &viewCount, nullptr)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:604"
               );
  uVar13 = (ulong)local_250;
  memset(&local_278,0,0x28);
  local_278.type = XR_TYPE_VIEW_CONFIGURATION_VIEW;
  std::vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>::resize
            (&this->m_configViews,uVar13,&local_278);
  pXVar4 = this->m_instance;
  XVar5 = this->m_systemId;
  peVar12 = std::__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<const_Options,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_options);
  uVar7 = local_250;
  XVar1 = (peVar12->Parsed).ViewConfigType;
  pXVar14 = std::vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>::data
                      (&this->m_configViews);
  XVar10 = xrEnumerateViewConfigurationViews(pXVar4,XVar5,XVar1,uVar7,&local_250,pXVar14);
  CheckXrResult(XVar10,
                "xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, viewCount, &viewCount, m_configViews.data())"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:607"
               );
  uVar13 = (ulong)local_250;
  memset(local_2b8,0,0x40);
  local_2b8 = (undefined1  [4])0x7;
  std::vector<XrView,_std::allocator<XrView>_>::resize
            (&this->m_views,uVar13,(value_type *)local_2b8);
  if (local_250 != 0) {
    XVar10 = xrEnumerateSwapchainFormats
                       (this->m_session,0,
                        (undefined1 *)
                        ((long)&swapchainFormats.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
    CheckXrResult(XVar10,"xrEnumerateSwapchainFormats(m_session, 0, &swapchainFormatCount, nullptr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:616"
                 );
    uVar13 = (ulong)swapchainFormats.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
    std::allocator<long>::allocator(&local_2d9);
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)local_2d8,uVar13,&local_2d9);
    std::allocator<long>::~allocator(&local_2d9);
    pXVar6 = this->m_session;
    sVar15 = std::vector<long,_std::allocator<long>_>::size
                       ((vector<long,_std::allocator<long>_> *)local_2d8);
    plVar16 = std::vector<long,_std::allocator<long>_>::data
                        ((vector<long,_std::allocator<long>_> *)local_2d8);
    XVar10 = xrEnumerateSwapchainFormats
                       (pXVar6,sVar15 & 0xffffffff,
                        (undefined1 *)
                        ((long)&swapchainFormats.super__Vector_base<long,_std::allocator<long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 4),plVar16);
    CheckXrResult(XVar10,
                  "xrEnumerateSwapchainFormats(m_session, (uint32_t)swapchainFormats.size(), &swapchainFormatCount, swapchainFormats.data())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:619"
                 );
    sVar15 = std::vector<long,_std::allocator<long>_>::size
                       ((vector<long,_std::allocator<long>_> *)local_2d8);
    if (swapchainFormats.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != sVar15) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_300,"Check failed",&local_301);
      Throw((string *)local_300,"swapchainFormatCount == swapchainFormats.size()",
            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:620"
           );
    }
    peVar17 = std::__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m_graphicsPlugin);
    iVar11 = (*peVar17->_vptr_IGraphicsPlugin[4])(peVar17,local_2d8);
    this->m_colorSwapchainFormat = CONCAT44(extraout_var,iVar11);
    std::__cxx11::string::string((string *)&__range3);
    __end3 = std::vector<long,_std::allocator<long>_>::begin
                       ((vector<long,_std::allocator<long>_> *)local_2d8);
    format = (int64_t)std::vector<long,_std::allocator<long>_>::end
                                ((vector<long,_std::allocator<long>_> *)local_2d8);
    while( true ) {
      bVar9 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                                  *)&format);
      if (!bVar9) break;
      plVar18 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
                operator*(&__end3);
      lStack_348 = *plVar18;
      local_349 = lStack_348 == this->m_colorSwapchainFormat;
      std::__cxx11::string::operator+=((string *)&__range3," ");
      if ((local_349 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)&__range3,"[");
      }
      std::__cxx11::to_string(local_370,lStack_348);
      std::__cxx11::string::operator+=((string *)&__range3,(string *)local_370);
      std::__cxx11::string::~string((string *)local_370);
      if ((local_349 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)&__range3,"]");
      }
      __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
                (&__end3);
    }
    uVar19 = std::__cxx11::string::c_str();
    Fmt_abi_cxx11_((char *)local_390,"Swapchain Formats: %s",uVar19);
    Log::Write(Verbose,local_390);
    std::__cxx11::string::~string((string *)local_390);
    std::__cxx11::string::~string((string *)&__range3);
    for (vp._4_4_ = 0; vp._4_4_ < local_250; vp._4_4_ = vp._4_4_ + 1) {
      local_3a0 = std::vector<XrViewConfigurationView,_std::allocator<XrViewConfigurationView>_>::
                  operator[](&this->m_configViews,(ulong)vp._4_4_);
      Fmt_abi_cxx11_((char *)local_3c0,
                     "Creating swapchain for view %d with dimensions Width=%d Height=%d SampleCount=%d"
                     ,(ulong)vp._4_4_,(ulong)local_3a0->recommendedImageRectWidth,
                     (ulong)local_3a0->recommendedImageRectHeight,
                     (ulong)local_3a0->recommendedSwapchainSampleCount);
      Log::Write(Info,local_3c0);
      std::__cxx11::string::~string((string *)local_3c0);
      swapchain.width = 9;
      swapchain.height = 0;
      uVar2 = local_3a0->recommendedImageRectWidth;
      uVar3 = local_3a0->recommendedImageRectHeight;
      peVar17 = std::__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_graphicsPlugin);
      (*peVar17->_vptr_IGraphicsPlugin[8])(peVar17,local_3a0);
      swapchain.handle._0_4_ = uVar2;
      swapchain.handle._4_4_ = uVar3;
      XVar10 = xrCreateSwapchain(this->m_session,&swapchain.width,auStack_418);
      CheckXrResult(XVar10,"xrCreateSwapchain(m_session, &swapchainCreateInfo, &swapchain.handle)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:660"
                   );
      std::vector<Swapchain,_std::allocator<Swapchain>_>::push_back
                (&this->m_swapchains,(value_type *)auStack_418);
      XVar10 = xrEnumerateSwapchainImages
                         (_auStack_418,0,
                          (undefined1 *)
                          ((long)&swapchainImages.
                                  super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0);
      CheckXrResult(XVar10,"xrEnumerateSwapchainImages(swapchain.handle, 0, &imageCount, nullptr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:665"
                   );
      peVar17 = std::__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<IGraphicsPlugin,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_graphicsPlugin);
      (*peVar17->_vptr_IGraphicsPlugin[6])
                (local_438,peVar17,
                 (ulong)swapchainImages.
                        super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,&swapchain.width);
      pXVar8 = _auStack_418;
      uVar7 = swapchainImages.
              super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      ppXVar20 = std::
                 vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                 ::operator[]((vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                               *)local_438,0);
      XVar10 = xrEnumerateSwapchainImages
                         (pXVar8,uVar7,
                          (undefined1 *)
                          ((long)&swapchainImages.
                                  super__Vector_base<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),*ppXVar20)
      ;
      CheckXrResult(XVar10,
                    "xrEnumerateSwapchainImages(swapchain.handle, imageCount, &imageCount, swapchainImages[0])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK-Source/src/tests/hello_xr/openxr_program.cpp:669"
                   );
      std::
      make_pair<XrSwapchain_T*&,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>
                (&local_458,(XrSwapchain_T **)auStack_418,
                 (vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>
                  *)local_438);
      std::
      map<XrSwapchain_T*,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>,std::less<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>>
      ::
      insert<std::pair<XrSwapchain_T*,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>
                ((map<XrSwapchain_T*,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>,std::less<XrSwapchain_T*>,std::allocator<std::pair<XrSwapchain_T*const,std::vector<XrSwapchainImageBaseHeader*,std::allocator<XrSwapchainImageBaseHeader*>>>>>
                  *)&this->m_swapchainImages,&local_458);
      std::
      pair<XrSwapchain_T_*,_std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>_>
      ::~pair(&local_458);
      std::vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_>::
      ~vector((vector<XrSwapchainImageBaseHeader_*,_std::allocator<XrSwapchainImageBaseHeader_*>_> *
              )local_438);
    }
    std::vector<long,_std::allocator<long>_>::~vector
              ((vector<long,_std::allocator<long>_> *)local_2d8);
  }
  return;
}

Assistant:

void CreateSwapchains() override {
        CHECK(m_session != XR_NULL_HANDLE);
        CHECK(m_swapchains.empty());
        CHECK(m_configViews.empty());

        // Read graphics properties for preferred swapchain length and logging.
        XrSystemProperties systemProperties{XR_TYPE_SYSTEM_PROPERTIES};
        CHECK_XRCMD(xrGetSystemProperties(m_instance, m_systemId, &systemProperties));

        // Log system properties.
        Log::Write(Log::Level::Info,
                   Fmt("System Properties: Name=%s VendorId=%d", systemProperties.systemName, systemProperties.vendorId));
        Log::Write(Log::Level::Info, Fmt("System Graphics Properties: MaxWidth=%d MaxHeight=%d MaxLayers=%d",
                                         systemProperties.graphicsProperties.maxSwapchainImageWidth,
                                         systemProperties.graphicsProperties.maxSwapchainImageHeight,
                                         systemProperties.graphicsProperties.maxLayerCount));
        Log::Write(Log::Level::Info, Fmt("System Tracking Properties: OrientationTracking=%s PositionTracking=%s",
                                         systemProperties.trackingProperties.orientationTracking == XR_TRUE ? "True" : "False",
                                         systemProperties.trackingProperties.positionTracking == XR_TRUE ? "True" : "False"));

        // Note: No other view configurations exist at the time this code was written. If this
        // condition is not met, the project will need to be audited to see how support should be
        // added.
        CHECK_MSG(m_options->Parsed.ViewConfigType == XR_VIEW_CONFIGURATION_TYPE_PRIMARY_STEREO,
                  "Unsupported view configuration type");

        // Query and cache view configuration views.
        uint32_t viewCount;
        CHECK_XRCMD(
            xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, 0, &viewCount, nullptr));
        m_configViews.resize(viewCount, {XR_TYPE_VIEW_CONFIGURATION_VIEW});
        CHECK_XRCMD(xrEnumerateViewConfigurationViews(m_instance, m_systemId, m_options->Parsed.ViewConfigType, viewCount,
                                                      &viewCount, m_configViews.data()));

        // Create and cache view buffer for xrLocateViews later.
        m_views.resize(viewCount, {XR_TYPE_VIEW});

        // Create the swapchain and get the images.
        if (viewCount > 0) {
            // Select a swapchain format.
            uint32_t swapchainFormatCount;
            CHECK_XRCMD(xrEnumerateSwapchainFormats(m_session, 0, &swapchainFormatCount, nullptr));
            std::vector<int64_t> swapchainFormats(swapchainFormatCount);
            CHECK_XRCMD(xrEnumerateSwapchainFormats(m_session, (uint32_t)swapchainFormats.size(), &swapchainFormatCount,
                                                    swapchainFormats.data()));
            CHECK(swapchainFormatCount == swapchainFormats.size());
            m_colorSwapchainFormat = m_graphicsPlugin->SelectColorSwapchainFormat(swapchainFormats);

            // Print swapchain formats and the selected one.
            {
                std::string swapchainFormatsString;
                for (int64_t format : swapchainFormats) {
                    const bool selected = format == m_colorSwapchainFormat;
                    swapchainFormatsString += " ";
                    if (selected) {
                        swapchainFormatsString += "[";
                    }
                    swapchainFormatsString += std::to_string(format);
                    if (selected) {
                        swapchainFormatsString += "]";
                    }
                }
                Log::Write(Log::Level::Verbose, Fmt("Swapchain Formats: %s", swapchainFormatsString.c_str()));
            }

            // Create a swapchain for each view.
            for (uint32_t i = 0; i < viewCount; i++) {
                const XrViewConfigurationView& vp = m_configViews[i];
                Log::Write(Log::Level::Info,
                           Fmt("Creating swapchain for view %d with dimensions Width=%d Height=%d SampleCount=%d", i,
                               vp.recommendedImageRectWidth, vp.recommendedImageRectHeight, vp.recommendedSwapchainSampleCount));

                // Create the swapchain.
                XrSwapchainCreateInfo swapchainCreateInfo{XR_TYPE_SWAPCHAIN_CREATE_INFO};
                swapchainCreateInfo.arraySize = 1;
                swapchainCreateInfo.format = m_colorSwapchainFormat;
                swapchainCreateInfo.width = vp.recommendedImageRectWidth;
                swapchainCreateInfo.height = vp.recommendedImageRectHeight;
                swapchainCreateInfo.mipCount = 1;
                swapchainCreateInfo.faceCount = 1;
                swapchainCreateInfo.sampleCount = m_graphicsPlugin->GetSupportedSwapchainSampleCount(vp);
                swapchainCreateInfo.usageFlags = XR_SWAPCHAIN_USAGE_SAMPLED_BIT | XR_SWAPCHAIN_USAGE_COLOR_ATTACHMENT_BIT;
                Swapchain swapchain;
                swapchain.width = swapchainCreateInfo.width;
                swapchain.height = swapchainCreateInfo.height;
                CHECK_XRCMD(xrCreateSwapchain(m_session, &swapchainCreateInfo, &swapchain.handle));

                m_swapchains.push_back(swapchain);

                uint32_t imageCount;
                CHECK_XRCMD(xrEnumerateSwapchainImages(swapchain.handle, 0, &imageCount, nullptr));
                // XXX This should really just return XrSwapchainImageBaseHeader*
                std::vector<XrSwapchainImageBaseHeader*> swapchainImages =
                    m_graphicsPlugin->AllocateSwapchainImageStructs(imageCount, swapchainCreateInfo);
                CHECK_XRCMD(xrEnumerateSwapchainImages(swapchain.handle, imageCount, &imageCount, swapchainImages[0]));

                m_swapchainImages.insert(std::make_pair(swapchain.handle, std::move(swapchainImages)));
            }
        }
    }